

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  bool bVar1;
  reference ppTVar2;
  UnitTestImpl *this_00;
  size_type sVar3;
  value_type_conflict1 local_10c;
  TestCase **local_108;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_100;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_f8;
  const_iterator local_f0;
  allocator local_e1;
  string local_e0;
  UnitTestImpl *local_c0;
  TestCase *new_test_case;
  allocator local_99;
  string local_98;
  TestCaseNameIs local_78;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_58;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_50;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_48;
  __normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  local_40;
  const_iterator test_case;
  TearDownTestCaseFunc tear_down_tc_local;
  SetUpTestCaseFunc set_up_tc_local;
  char *type_param_local;
  char *test_case_name_local;
  UnitTestImpl *this_local;
  
  test_case._M_current = (TestCase **)tear_down_tc;
  local_50._M_current =
       (TestCase **)
       std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::begin
                 (&this->test_cases_);
  local_58._M_current =
       (TestCase **)
       std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::end
                 (&this->test_cases_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,test_case_name,&local_99);
  TestCaseNameIs::TestCaseNameIs(&local_78,&local_98);
  local_48 = std::
             find_if<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>,testing::internal::TestCaseNameIs>
                       (local_50,local_58,&local_78);
  __gnu_cxx::
  __normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
  ::__normal_iterator<testing::TestCase**>
            ((__normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
              *)&local_40,&local_48);
  TestCaseNameIs::~TestCaseNameIs(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  new_test_case =
       (TestCase *)
       std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::end
                 (&this->test_cases_);
  bVar1 = __gnu_cxx::operator!=
                    (&local_40,
                     (__normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                      *)&new_test_case);
  if (bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestCase_*const_*,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
              ::operator*(&local_40);
    this_local = (UnitTestImpl *)*ppTVar2;
  }
  else {
    this_00 = (UnitTestImpl *)operator_new(0xf8);
    TestCase::TestCase((TestCase *)this_00,test_case_name,type_param,set_up_tc,
                       (TearDownTestCaseFunc)test_case._M_current);
    local_c0 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,test_case_name,&local_e1);
    bVar1 = UnitTestOptions::MatchesFilter(&local_e0,"*DeathTest:*DeathTest/*");
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    if (bVar1) {
      this->last_death_test_case_ = this->last_death_test_case_ + 1;
      local_100._M_current =
           (TestCase **)
           std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::begin
                     (&this->test_cases_);
      local_f8 = __gnu_cxx::
                 __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
                 ::operator+(&local_100,(long)this->last_death_test_case_);
      __gnu_cxx::
      __normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
      ::__normal_iterator<testing::TestCase**>
                ((__normal_iterator<testing::TestCase*const*,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>
                  *)&local_f0,&local_f8);
      local_108 = (TestCase **)
                  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                            (&this->test_cases_,local_f0,(value_type *)&local_c0);
    }
    else {
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::push_back
                (&this->test_cases_,(value_type *)&local_c0);
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->test_case_indices_);
    local_10c = (value_type_conflict1)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back(&this->test_case_indices_,&local_10c);
    this_local = local_c0;
  }
  return (TestCase *)this_local;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_iterator test_case =
      std::find_if(test_cases_.begin(), test_cases_.end(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.end())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}